

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O2

void fallbackSort(UInt32 *fmap,UInt32 *eclass,UInt32 *bhtab,Int32 nblock,Int32 verb)

{
  uint uVar1;
  UInt32 UVar2;
  byte bVar3;
  int iVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  UInt32 UVar15;
  long lVar16;
  int *piVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  UInt32 *pUVar28;
  uint uVar29;
  long lVar30;
  uint uVar32;
  long local_bd8;
  int local_bcc;
  int local_bc0;
  uint local_bb0;
  int local_bac;
  int local_ba8;
  int local_ba4;
  uint local_b68 [100];
  Int32 stackLo [100];
  Int32 ftab [257];
  Int32 ftabCopy [256];
  ulong uVar31;
  
  for (lVar8 = 0; lVar8 != 0x101; lVar8 = lVar8 + 1) {
    ftab[lVar8] = 0;
  }
  uVar9 = 0;
  uVar25 = 0;
  if (0 < nblock) {
    uVar25 = (ulong)(uint)nblock;
  }
  for (; uVar25 != uVar9; uVar9 = uVar9 + 1) {
    ftab[*(byte *)((long)eclass + uVar9)] = ftab[*(byte *)((long)eclass + uVar9)] + 1;
  }
  for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1) {
    ftabCopy[lVar8] = ftab[lVar8];
  }
  for (lVar8 = 1; lVar8 != 0x101; lVar8 = lVar8 + 1) {
    ftab[lVar8] = ftab[lVar8] + stackLo[lVar8 + 99];
  }
  for (uVar9 = 0; uVar25 != uVar9; uVar9 = uVar9 + 1) {
    iVar19 = ftab[*(byte *)((long)eclass + uVar9)];
    ftab[*(byte *)((long)eclass + uVar9)] = iVar19 + -1;
    fmap[(long)iVar19 + -1] = (UInt32)uVar9;
  }
  iVar19 = nblock / 0x20;
  if (nblock / 0x20 < -1) {
    iVar19 = -2;
  }
  for (uVar9 = 0; iVar19 + 2 != uVar9; uVar9 = uVar9 + 1) {
    bhtab[uVar9] = 0;
  }
  for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1) {
    bhtab[ftab[lVar8] >> 5] = bhtab[ftab[lVar8] >> 5] | 1 << ((byte)ftab[lVar8] & 0x1f);
  }
  for (iVar19 = 0; iVar19 != 0x40; iVar19 = iVar19 + 2) {
    bhtab[nblock + iVar19 >> 5] =
         bhtab[nblock + iVar19 >> 5] | 1 << ((byte)(nblock + iVar19) & 0x1f);
    iVar14 = nblock + 1 + iVar19;
    bVar3 = (byte)iVar14 & 0x1f;
    bhtab[iVar14 >> 5] = bhtab[iVar14 >> 5] & (-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3);
  }
  iVar19 = 1;
  do {
    uVar12 = 0;
    for (uVar9 = 0; uVar25 != uVar9; uVar9 = uVar9 + 1) {
      if ((bhtab[uVar9 >> 5 & 0x7ffffff] >> ((uint)uVar9 & 0x1f) & 1) != 0) {
        uVar12 = uVar9 & 0xffffffff;
      }
      eclass[(int)(((int)(fmap[uVar9] - iVar19) >> 0x1f & nblock) + (fmap[uVar9] - iVar19))] =
           (UInt32)uVar12;
    }
    local_bcc = 0;
    uVar18 = 0;
LAB_006144bf:
    uVar7 = uVar18 - 1;
    iVar14 = uVar18 - 0x20;
    do {
      uVar32 = uVar18;
      iVar6 = iVar14;
      uVar11 = uVar7;
      uVar20 = 1 << ((byte)uVar32 & 0x1f) & bhtab[(int)uVar32 >> 5];
      if ((uVar32 & 0x1f) == 0) break;
      uVar7 = uVar11 + 1;
      iVar14 = iVar6 + 1;
      uVar18 = uVar32 + 1;
    } while (uVar20 != 0);
    if (uVar20 != 0) {
      do {
        uVar32 = uVar11;
        iVar6 = iVar6 + 0x20;
        uVar11 = uVar32 + 0x20;
      } while (bhtab[iVar6 >> 5] == 0xffffffff);
      do {
        uVar32 = uVar32 + 1;
      } while ((bhtab[(int)uVar32 >> 5] >> (uVar32 & 0x1f) & 1) != 0);
    }
    if ((int)uVar32 <= nblock) {
      uVar7 = uVar32 - 1;
      uVar11 = uVar32;
      iVar14 = uVar32 - 0x20;
      do {
        iVar6 = iVar14;
        uVar18 = uVar11;
        uVar20 = uVar7;
        uVar21 = 1 << (sbyte)(uVar18 & 0x1f) & bhtab[(int)uVar18 >> 5];
        if ((uVar18 & 0x1f) == 0) break;
        uVar7 = uVar20 + 1;
        uVar11 = uVar18 + 1;
        iVar14 = iVar6 + 1;
      } while (uVar21 == 0);
      if (uVar21 == 0) {
        do {
          uVar18 = uVar20;
          iVar6 = iVar6 + 0x20;
          uVar20 = uVar18 + 0x20;
        } while (bhtab[iVar6 >> 5] == 0);
        do {
          uVar18 = uVar18 + 1;
        } while ((bhtab[(int)uVar18 >> 5] >> (uVar18 & 0x1f) & 1) == 0);
      }
      if (nblock < (int)uVar18) goto LAB_00614a00;
      if ((int)uVar32 < (int)uVar18) {
        stackLo[0] = uVar32 - 1;
        local_b68[0] = uVar18 - 1;
        local_bb0 = 0;
        uVar9 = 1;
LAB_006145d3:
        uVar12 = uVar9 & 0xffffffff;
        while (0 < (int)(uint)uVar12) {
          if (0x62 < uVar12) {
            bz_internal_error(0x3ec);
          }
          uVar9 = uVar12 - 1;
          uVar27 = uVar9 & 0xffffffff;
          uVar7 = stackLo[uVar27];
          uVar13 = (ulong)uVar7;
          lVar8 = (long)(int)uVar7;
          uVar11 = local_b68[uVar27];
          if (9 < (int)(uVar11 - uVar7)) {
            local_bb0 = local_bb0 * 0x1dc5 + 1 & 0x7fff;
            uVar20 = uVar7;
            if (((short)(local_bb0 % 3) != 0) && (uVar20 = uVar11, local_bb0 % 3 == 1)) {
              uVar20 = (int)(uVar11 + uVar7) >> 1;
            }
            UVar15 = eclass[fmap[(int)uVar20]];
            uVar31 = uVar13;
            uVar21 = uVar11;
            uVar20 = uVar11;
LAB_0061476e:
            lVar10 = (long)(int)uVar21 + 1;
            local_ba4 = (int)uVar13;
            uVar13 = (ulong)local_ba4;
            local_ba8 = local_ba4 - uVar7;
            local_ba4 = -local_ba4;
LAB_0061478f:
            uVar29 = (uint)uVar31;
            lVar16 = (long)(int)uVar29;
            lVar23 = lVar16;
            do {
              uVar29 = uVar29 + 1;
              uVar31 = (ulong)uVar29;
              if ((int)uVar21 < lVar23) {
                lVar23 = lVar16;
                if (lVar16 < lVar10) {
                  lVar23 = lVar10;
                }
LAB_006147f1:
                iVar14 = (int)lVar23;
                lVar10 = (long)iVar14;
                local_bd8 = (long)(int)uVar20;
                local_bac = uVar11 - uVar20;
                goto LAB_0061480b;
              }
              uVar1 = fmap[lVar23];
              UVar2 = eclass[uVar1];
              if (UVar2 == UVar15) goto LAB_006147b2;
              if (UVar2 != UVar15 && (int)UVar15 <= (int)UVar2) goto LAB_006147f1;
              lVar23 = lVar23 + 1;
            } while( true );
          }
          uVar12 = uVar9;
          if (uVar11 != uVar7) {
            lVar10 = (long)(int)uVar11;
            if (3 < (int)(uVar11 - uVar7)) {
              lVar16 = (long)(int)(uVar11 - 4);
              lVar24 = lVar16 << 0x20;
              lVar23 = lVar16 + 4;
              for (; lVar8 <= lVar16; lVar16 = lVar16 + -1) {
                UVar15 = fmap[lVar16];
                uVar7 = eclass[(int)UVar15];
                lVar26 = lVar23;
                lVar30 = lVar24;
                while ((lVar26 <= lVar10 && (eclass[fmap[lVar26]] < uVar7))) {
                  fmap[lVar26 + -4] = fmap[lVar26];
                  lVar30 = lVar30 + 0x400000000;
                  lVar26 = lVar26 + 4;
                }
                *(UInt32 *)((long)fmap + (lVar30 >> 0x1e)) = UVar15;
                lVar24 = lVar24 + -0x100000000;
                lVar23 = lVar23 + -1;
              }
            }
            lVar16 = lVar10 << 0x20;
            lVar23 = lVar10;
            while (lVar24 = lVar23 + -1, lVar8 < lVar23) {
              UVar15 = fmap[lVar24];
              uVar7 = eclass[(int)UVar15];
              lVar26 = lVar16;
              while ((lVar23 <= lVar10 && (eclass[fmap[lVar23]] < uVar7))) {
                fmap[lVar23 + -1] = fmap[lVar23];
                lVar23 = lVar23 + 1;
                lVar26 = lVar26 + 0x100000000;
              }
              *(UInt32 *)((long)fmap + (lVar26 >> 0x1e) + -4) = UVar15;
              lVar16 = lVar16 + -0x100000000;
              lVar23 = lVar24;
            }
          }
        }
        UVar15 = 0xffffffff;
        for (lVar8 = (long)(int)(uVar32 - 1); lVar8 < (int)uVar18; lVar8 = lVar8 + 1) {
          UVar2 = eclass[fmap[lVar8]];
          if (UVar15 != UVar2) {
            bhtab[(int)lVar8 >> 5] = bhtab[(int)lVar8 >> 5] | 1 << ((byte)lVar8 & 0x1f);
            UVar15 = UVar2;
          }
        }
        local_bcc = (local_bcc - uVar32) + 1 + uVar18;
      }
      goto LAB_006144bf;
    }
LAB_00614a00:
    iVar19 = iVar19 * 2;
    if ((nblock < iVar19) || (local_bcc == 0)) {
      iVar19 = 0;
      for (uVar9 = 0; uVar9 != uVar25; uVar9 = uVar9 + 1) {
        lVar8 = (long)iVar19;
        iVar19 = iVar19 + -1;
        piVar5 = ftabCopy + lVar8;
        do {
          piVar17 = piVar5;
          iVar19 = iVar19 + 1;
          piVar5 = piVar17 + 1;
        } while (*piVar17 == 0);
        *piVar17 = *piVar17 + -1;
        *(char *)((long)eclass + (ulong)fmap[uVar9]) = (char)iVar19;
      }
      if (0xff < iVar19) {
        bz_internal_error(0x3ed);
        return;
      }
      return;
    }
  } while( true );
LAB_006147b2:
  fmap[lVar23] = fmap[uVar13];
  fmap[uVar13] = uVar1;
  uVar13 = uVar13 + 1;
  local_ba8 = local_ba8 + 1;
  local_ba4 = local_ba4 + -1;
  goto LAB_0061478f;
LAB_0061480b:
  lVar16 = (long)(int)uVar21;
  iVar6 = uVar20 - uVar21;
  uVar21 = -uVar21;
  lVar23 = lVar16;
  while( true ) {
    uVar29 = (uint)local_bd8;
    if (lVar23 < lVar10) {
      lVar23 = lVar10 + -1;
      if (lVar16 <= lVar10 + -1) {
        lVar23 = lVar16;
      }
      if ((long)uVar13 <= local_bd8) {
        uVar20 = (uint)uVar13;
        iVar22 = iVar14 - uVar20;
        if ((int)(uVar20 - uVar7) < (int)(iVar14 - uVar20)) {
          iVar22 = uVar20 - uVar7;
        }
        iVar4 = local_ba4 + iVar14;
        if (local_ba8 < local_ba4 + iVar14) {
          iVar4 = local_ba8;
        }
        pUVar28 = fmap;
        for (; 0 < iVar22; iVar22 = iVar22 + -1) {
          UVar15 = pUVar28[lVar8];
          pUVar28[lVar8] = pUVar28[iVar14 - iVar4];
          pUVar28[iVar14 - iVar4] = UVar15;
          pUVar28 = pUVar28 + 1;
        }
        local_bc0 = (int)lVar23;
        local_bc0 = uVar29 - local_bc0;
        iVar22 = uVar11 - uVar29;
        if (local_bc0 <= (int)(uVar11 - uVar29)) {
          iVar22 = local_bc0;
        }
        if (local_bac < iVar6) {
          iVar6 = local_bac;
        }
        pUVar28 = fmap;
        for (; 0 < iVar22; iVar22 = iVar22 + -1) {
          UVar15 = pUVar28[iVar14];
          pUVar28[iVar14] = pUVar28[(long)(int)(uVar11 - iVar6) + 1];
          pUVar28[(long)(int)(uVar11 - iVar6) + 1] = UVar15;
          pUVar28 = pUVar28 + 1;
        }
        uVar21 = uVar7 + ~uVar20 + iVar14;
        uVar29 = (uVar11 - local_bc0) + 1;
        if ((int)(uVar11 - uVar29) < (int)(~uVar20 + iVar14)) {
          local_b68[uVar27] = uVar21;
          uVar7 = uVar29;
          uVar21 = uVar11;
        }
        else {
          stackLo[uVar27] = uVar29;
        }
        uVar11 = (uint)uVar12 & 0x7fffffff;
        stackLo[uVar11] = uVar7;
        local_b68[uVar11] = uVar21;
        uVar9 = uVar12 + 1;
      }
      goto LAB_006145d3;
    }
    uVar1 = fmap[lVar23];
    if (eclass[uVar1] == UVar15) break;
    if ((int)eclass[uVar1] < (int)UVar15) {
      uVar21 = ~uVar21;
      UVar2 = fmap[lVar10];
      fmap[lVar10] = uVar1;
      fmap[lVar23] = UVar2;
      uVar31 = (ulong)(iVar14 + 1);
      uVar20 = uVar29;
      goto LAB_0061476e;
    }
    lVar23 = lVar23 + -1;
    uVar21 = uVar21 + 1;
    iVar6 = iVar6 + 1;
  }
  fmap[lVar23] = fmap[local_bd8];
  fmap[local_bd8] = uVar1;
  local_bd8 = local_bd8 + -1;
  uVar21 = ~uVar21;
  local_bac = local_bac + 1;
  uVar20 = uVar20 - 1;
  goto LAB_0061480b;
}

Assistant:

static
void fallbackSort ( UInt32* fmap, 
                    UInt32* eclass, 
                    UInt32* bhtab,
                    Int32   nblock,
                    Int32   verb )
{
   Int32 ftab[257];
   Int32 ftabCopy[256];
   Int32 H, i, j, k, l, r, cc, cc1;
   Int32 nNotDone;
   Int32 nBhtab;
   UChar* eclass8 = (UChar*)eclass;

   /*--
      Initial 1-char radix sort to generate
      initial fmap and initial BH bits.
   --*/
   if (verb >= 4)
      VPrintf0 ( "        bucket sorting ...\n" );
   for (i = 0; i < 257;    i++) ftab[i] = 0;
   for (i = 0; i < nblock; i++) ftab[eclass8[i]]++;
   for (i = 0; i < 256;    i++) ftabCopy[i] = ftab[i];
   for (i = 1; i < 257;    i++) ftab[i] += ftab[i-1];

   for (i = 0; i < nblock; i++) {
      j = eclass8[i];
      k = ftab[j] - 1;
      ftab[j] = k;
      fmap[k] = i;
   }

   nBhtab = 2 + (nblock / 32);
   for (i = 0; i < nBhtab; i++) bhtab[i] = 0;
   for (i = 0; i < 256; i++) SET_BH(ftab[i]);

   /*--
      Inductively refine the buckets.  Kind-of an
      "exponential radix sort" (!), inspired by the
      Manber-Myers suffix array construction algorithm.
   --*/

   /*-- set sentinel bits for block-end detection --*/
   for (i = 0; i < 32; i++) { 
      SET_BH(nblock + 2*i);
      CLEAR_BH(nblock + 2*i + 1);
   }

   /*-- the log(N) loop --*/
   H = 1;
   while (1) {

      if (verb >= 4) 
         VPrintf1 ( "        depth %6d has ", H );

      j = 0;
      for (i = 0; i < nblock; i++) {
         if (ISSET_BH(i)) j = i;
         k = fmap[i] - H; if (k < 0) k += nblock;
         eclass[k] = j;
      }

      nNotDone = 0;
      r = -1;
      while (1) {

	 /*-- find the next non-singleton bucket --*/
         k = r + 1;
         while (ISSET_BH(k) && UNALIGNED_BH(k)) k++;
         if (ISSET_BH(k)) {
            while (WORD_BH(k) == 0xffffffff) k += 32;
            while (ISSET_BH(k)) k++;
         }
         l = k - 1;
         if (l >= nblock) break;
         while (!ISSET_BH(k) && UNALIGNED_BH(k)) k++;
         if (!ISSET_BH(k)) {
            while (WORD_BH(k) == 0x00000000) k += 32;
            while (!ISSET_BH(k)) k++;
         }
         r = k - 1;
         if (r >= nblock) break;

         /*-- now [l, r] bracket current bucket --*/
         if (r > l) {
            nNotDone += (r - l + 1);
            fallbackQSort3 ( fmap, eclass, l, r );

            /*-- scan bucket and generate header bits-- */
            cc = -1;
            for (i = l; i <= r; i++) {
               cc1 = eclass[fmap[i]];
               if (cc != cc1) { SET_BH(i); cc = cc1; };
            }
         }
      }

      if (verb >= 4) 
         VPrintf1 ( "%6d unresolved strings\n", nNotDone );

      H *= 2;
      if (H > nblock || nNotDone == 0) break;
   }

   /*-- 
      Reconstruct the original block in
      eclass8 [0 .. nblock-1], since the
      previous phase destroyed it.
   --*/
   if (verb >= 4)
      VPrintf0 ( "        reconstructing block ...\n" );
   j = 0;
   for (i = 0; i < nblock; i++) {
      while (ftabCopy[j] == 0) j++;
      ftabCopy[j]--;
      eclass8[fmap[i]] = (UChar)j;
   }
   AssertH ( j < 256, 1005 );
}